

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

void putRGBcontig8bitCMYKtile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  if (h == 0) {
    return;
  }
  uVar4 = (ulong)img->samplesperpixel;
  lVar1 = uVar4 * 2 + -3;
  if (7 < w) {
    do {
      uVar5 = pp[3] ^ 0xff;
      *cp = ((pp[2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
            ((pp[1] ^ 0xff) * uVar5) / 0xff << 8 | ((*pp ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar4 + 3] ^ 0xff;
      lVar2 = uVar4 + 3;
      cp[1] = ((pp[uVar4 + 2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
              ((pp[uVar4 + 1] ^ 0xff) * uVar5) / 0xff << 8 | ((pp[uVar4] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar4 + lVar2] ^ 0xff;
      lVar3 = uVar4 + lVar2;
      cp[2] = ((pp[(uVar4 - 1) + lVar2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
              ((pp[(uVar4 - 2) + lVar2] ^ 0xff) * uVar5) / 0xff << 8 |
              ((pp[(uVar4 - 3) + lVar2] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar4 + lVar3] ^ 0xff;
      lVar2 = uVar4 + lVar3;
      cp[3] = ((pp[(uVar4 - 1) + lVar3] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
              ((pp[(uVar4 - 2) + lVar3] ^ 0xff) * uVar5) / 0xff << 8 |
              ((pp[(uVar4 - 3) + lVar3] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar4 + lVar2] ^ 0xff;
      lVar3 = uVar4 + lVar2;
      cp[4] = ((pp[(uVar4 - 1) + lVar2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
              ((pp[(uVar4 - 2) + lVar2] ^ 0xff) * uVar5) / 0xff << 8 |
              ((pp[(uVar4 - 3) + lVar2] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar4 + lVar3] ^ 0xff;
      lVar2 = uVar4 + lVar3;
      cp[5] = ((pp[(uVar4 - 1) + lVar3] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
              ((pp[(uVar4 - 2) + lVar3] ^ 0xff) * uVar5) / 0xff << 8 |
              ((pp[(uVar4 - 3) + lVar3] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar4 + lVar2] ^ 0xff;
      lVar3 = uVar4 + lVar2;
      cp[6] = ((pp[(uVar4 - 1) + lVar2] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
              ((pp[(uVar4 - 2) + lVar2] ^ 0xff) * uVar5) / 0xff << 8 |
              ((pp[(uVar4 - 3) + lVar2] ^ 0xff) * uVar5) / 0xff;
      uVar5 = pp[uVar4 + lVar3] ^ 0xff;
      cp[7] = ((pp[(uVar4 - 1) + lVar3] ^ 0xff) * uVar5) / 0xff << 0x10 | 0xff000000 |
              ((pp[(uVar4 - 2) + lVar3] ^ 0xff) * uVar5) / 0xff << 8 |
              ((pp[(uVar4 - 3) + lVar3] ^ 0xff) * uVar5) / 0xff;
      cp = cp + 8;
      w = w - 8;
      pp = pp + lVar1 + lVar3;
    } while (7 < w);
  }
  (*(code *)(&DAT_003335fc + *(int *)(&DAT_003335fc + (ulong)w * 4)))
            (lVar1,cp,&DAT_003335fc + *(int *)(&DAT_003335fc + (ulong)w * 4),(long)fromskew * uVar4)
  ;
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBcontig8bitCMYKtile)
{
    int samplesperpixel = img->samplesperpixel;
    uint16_t r, g, b, k;

    (void)x;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        UNROLL8(w, NOP, k = 255 - pp[3]; r = (k * (255 - pp[0])) / 255;
                g = (k * (255 - pp[1])) / 255; b = (k * (255 - pp[2])) / 255;
                *cp++ = PACK(r, g, b); pp += samplesperpixel);
        cp += toskew;
        pp += fromskew;
    }
}